

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

void CLI::detail::format_help(stringstream *out,string *name,string *description,size_t wid)

{
  ostream *poVar1;
  long lVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  poVar1 = (ostream *)(out + 0x10);
  lVar2 = *(long *)(out + 0x10);
  *(long *)(out + *(long *)(lVar2 + -0x18) + 0x20) = (long)(int)wid;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(out + lVar2 + 0x28) = *(uint *)(out + lVar2 + 0x28) & 0xffffff4f | 0x20;
  ::std::operator<<(poVar1,(string *)name);
  if (description->_M_string_length != 0) {
    if (wid <= name->_M_string_length) {
      poVar3 = ::std::endl<char,std::char_traits<char>>(poVar1);
      *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = (long)(int)wid;
      ::std::operator<<(poVar3,"");
    }
    ::std::operator<<(poVar1,(string *)description);
  }
  ::std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

inline void format_help(std::stringstream &out, std::string name, std::string description, size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << std::endl << std::setw(static_cast<int>(wid)) << "";
        out << description;
    }
    out << std::endl;
}